

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gensprep.c
# Opt level: O2

void normalizationCorrectionsLineFn
               (void *context,char *(*fields) [2],int32_t fieldCount,UErrorCode *pErrorCode)

{
  FILE *__stream;
  int32_t length;
  ulong uVar1;
  char *pcVar2;
  UVersionInfo version;
  UVersionInfo thisVersion;
  char *end;
  uint32_t mapping [40];
  
  uVar1 = strtoul((*fields)[0],&end,0x10);
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    length = u_parseCodePoints(fields[1][0],mapping,0x28,pErrorCode);
    u_versionFromString_63(version,fields[3][0]);
    u_versionFromString_63(thisVersion,"3.2.0");
    __stream = _stderr;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((thisVersion[0] < version[0]) ||
         ((version[0] == thisVersion[0] && (thisVersion[1] < version[1])))) {
        storeMapping((uint32_t)uVar1,mapping,length,USPREP_MAP,pErrorCode);
      }
      setUnicodeVersionNC(version);
      return;
    }
    pcVar2 = u_errorName_63(*pErrorCode);
    fprintf(__stream,"gensprep error parsing NormalizationCorrections.txt of U+%04lx - %s\n",
            uVar1 & 0xffffffff,pcVar2);
  }
  else {
    fprintf(_stderr,"gensprep: error parsing NormalizationCorrections.txt mapping at %s\n",
            (*fields)[0]);
  }
  exit(*pErrorCode);
}

Assistant:

static void U_CALLCONV
normalizationCorrectionsLineFn(void *context,
                    char *fields[][2], int32_t fieldCount,
                    UErrorCode *pErrorCode) {
    uint32_t mapping[40];
    char *end, *s;
    uint32_t code;
    int32_t length;
    UVersionInfo version;
    UVersionInfo thisVersion;

    /* get the character code, field 0 */
    code=(uint32_t)uprv_strtoul(fields[0][0], &end, 16);
    if(U_FAILURE(*pErrorCode)) {
        fprintf(stderr, "gensprep: error parsing NormalizationCorrections.txt mapping at %s\n", fields[0][0]);
        exit(*pErrorCode);
    }
    /* Original (erroneous) decomposition */
    s = fields[1][0];

    /* parse the mapping string */
    length=u_parseCodePoints(s, mapping, sizeof(mapping)/4, pErrorCode);

    /* ignore corrected decomposition */

    u_versionFromString(version,fields[3][0] );
    u_versionFromString(thisVersion, "3.2.0");



    if(U_FAILURE(*pErrorCode)) {
        fprintf(stderr, "gensprep error parsing NormalizationCorrections.txt of U+%04lx - %s\n",
                (long)code, u_errorName(*pErrorCode));
        exit(*pErrorCode);
    }

    /* store the mapping */
    if( version[0] > thisVersion[0] || 
        ((version[0]==thisVersion[0]) && (version[1] > thisVersion[1]))
        ){
        storeMapping(code,mapping, length, USPREP_MAP, pErrorCode);
    }
    setUnicodeVersionNC(version);
}